

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

int str2role(char *str)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int local_1c;
  int len;
  int i;
  char *str_local;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    str_local._4_4_ = -1;
  }
  else {
    sVar3 = strlen(str);
    iVar2 = (int)sVar3;
    local_1c = 0;
    while (roles[local_1c].name.m != (char *)0x0) {
      iVar1 = strncasecmp(str,roles[local_1c].name.m,(long)iVar2);
      if (iVar1 == 0) {
        return local_1c;
      }
      if ((roles[local_1c].name.f != (char *)0x0) &&
         (iVar1 = strncasecmp(str,roles[local_1c].name.f,(long)iVar2), iVar1 == 0)) {
        return local_1c;
      }
      iVar1 = strncasecmp(str,roles[local_1c].filecode,0xffffffffffffffff);
      if (iVar1 == 0) {
        return local_1c;
      }
      local_1c = local_1c + 1;
    }
    if (((iVar2 != 1) || ((*str != '*' && (*str != '@')))) &&
       (iVar2 = strncasecmp(str,"random",(long)iVar2), iVar2 != 0)) {
      return -1;
    }
    str_local._4_4_ = -2;
  }
  return str_local._4_4_;
}

Assistant:

int str2role(char *str)
{
	int i, len;

	/* Is str valid? */
	if (!str || !str[0])
	    return ROLE_NONE;

	/* Match as much of str as is provided */
	len = strlen(str);
	for (i = 0; roles[i].name.m; i++) {
	    /* Does it match the male name? */
	    if (!strncmpi(str, roles[i].name.m, len))
		return i;
	    /* Or the female name? */
	    if (roles[i].name.f && !strncmpi(str, roles[i].name.f, len))
		return i;
	    /* Or the filecode? */
	    if (!strcmpi(str, roles[i].filecode))
		return i;
	}

	if ((len == 1 && (*str == '*' || *str == '@')) ||
		!strncmpi(str, randomstr, len))
	    return ROLE_RANDOM;

	/* Couldn't find anything appropriate */
	return ROLE_NONE;
}